

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::M3DImporter::importMeshes(M3DImporter *this,M3DWrapper *m3d)

{
  m3dv_t *pmVar1;
  aiScene *paVar2;
  vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *pvVar3;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var4;
  _Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *p_Var5;
  uint uVar6;
  _Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> *p_Var7;
  Logger *this_00;
  ulong uVar8;
  aiMesh *this_01;
  M3DImporter *this_02;
  aiFace *__x;
  uint *puVar9;
  m3d_t *pmVar10;
  aiMesh **ppaVar11;
  pointer __src;
  m3df_t *pmVar12;
  size_t __n;
  long lVar13;
  ulong uVar14;
  pointer ppaVar15;
  M3DImporter *pMVar16;
  vector<aiFace,_std::allocator<aiFace>_> *faces;
  long lVar17;
  uint l;
  vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *local_238;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *local_230;
  _Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_228;
  _Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_220;
  aiMesh *pMesh;
  ulong local_210;
  value_type local_208;
  value_type local_1f8;
  M3DImporter *local_1e8;
  _Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> *local_1e0;
  vector<aiFace,_std::allocator<aiFace>_> *local_1d8;
  undefined8 local_1d0;
  M3D_FLOAT local_1c8;
  ulong local_1b0;
  aiColor4D local_1a8 [23];
  
  p_Var7 = (_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> *)operator_new(0x18);
  (p_Var7->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMesh = (aiMesh *)0x0;
  (p_Var7->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (p_Var7->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x180,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x181,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  if (this->mScene->mRootNode == (aiNode *)0x0) {
    __assert_fail("mScene->mRootNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x182,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[19]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [19])"M3D: importMeshes ");
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
             &m3d->m3d_->numface);
  std::__cxx11::stringbuf::str();
  local_1e8 = this;
  local_1e0 = p_Var7;
  Logger::debug(this_00,local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  lVar13 = 0;
  faces = (vector<aiFace,_std::allocator<aiFace>_> *)0x0;
  this_02 = (M3DImporter *)0x0;
  local_220 = (_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
  local_228 = (_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
  local_238 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0;
  local_230 = (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  uVar14 = 0;
  uVar8 = 0xfffffffffffffffe;
  while (p_Var7 = local_1e0, pMVar16 = local_1e8, p_Var5 = local_220, uVar14 < m3d->m3d_->numface) {
    uVar6 = m3d->m3d_->face[uVar14].materialid;
    local_210 = (ulong)uVar6;
    local_1b0 = uVar14;
    if ((uint)uVar8 != uVar6) {
      if (((this_02 != (M3DImporter *)0x0 && pMesh != (aiMesh *)0x0) &&
          (faces != (vector<aiFace,_std::allocator<aiFace>_> *)0x0 &&
           *(pointer *)&(this_02->super_BaseImporter).importerUnits._M_t._M_impl !=
           ((_Vector_impl_data *)&(this_02->super_BaseImporter)._vptr_BaseImporter)->_M_start)) &&
         ((faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
          super__Vector_impl_data._M_start)) {
        populateMesh(local_1e8,m3d,pMesh,faces,
                     (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_02,
                     (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_220,
                     (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_228,
                     (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_238,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0,&pMesh);
        std::vector<aiFace,_std::allocator<aiFace>_>::~vector(faces);
        operator_delete(faces,0x18);
        std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                  ((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_02);
        operator_delete(this_02,0x18);
        if (p_Var5 != (_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
          std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                    (p_Var5);
        }
        operator_delete(p_Var5,0x18);
        p_Var5 = local_228;
        if (local_228 != (_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0
           ) {
          std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                    (local_228);
        }
        operator_delete(p_Var5,0x18);
        p_Var4 = local_230;
        uVar6 = (uint)local_210;
        if (local_238 != (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0) {
          std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
                    ((_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_238
                    );
        }
        operator_delete(local_238,0x18);
        if (p_Var4 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var4);
        }
        operator_delete(p_Var4,0x18);
      }
      this_01 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_01);
      this_01->mPrimitiveTypes = 4;
      this_01->mMaterialIndex = uVar6 + 1;
      pMesh = this_01;
      local_1d8 = (vector<aiFace,_std::allocator<aiFace>_> *)operator_new(0x18);
      (local_1d8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_1d8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_1d8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_02 = (M3DImporter *)operator_new(0x18);
      ((_Vector_impl_data *)&(this_02->super_BaseImporter)._vptr_BaseImporter)->_M_start =
           (pointer)0x0;
      *(pointer *)&(this_02->super_BaseImporter).importerUnits._M_t._M_impl = (pointer)0x0;
      *(pointer *)
       &(this_02->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header =
           (pointer)0x0;
      local_220 = (_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                  operator_new(0x18);
      (local_220->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (local_220->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_220->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228 = (_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                  operator_new(0x18);
      (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_228->_M_impl)
      ->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_228->_M_impl)
      ->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_228->_M_impl)
      ->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_238 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)operator_new(0x18);
      *(undefined8 *)local_238 = 0;
      *(pointer *)(local_238 + 8) = (pointer)0x0;
      *(pointer *)(local_238 + 0x10) = (pointer)0x0;
      local_230 = (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_230->_M_impl)->_M_impl).
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_230->_M_impl)->_M_impl).
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_230->_M_impl)->_M_impl).
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar8 = local_210;
      faces = local_1d8;
    }
    local_1d8 = faces;
    local_210 = uVar8;
    __x = (aiFace *)operator_new(0x10);
    __x->mIndices = (uint *)0x0;
    __x->mNumIndices = 3;
    puVar9 = (uint *)operator_new__(0xc);
    __x->mIndices = puVar9;
    for (lVar17 = 0; faces = local_1d8, lVar17 != 0xc; lVar17 = lVar17 + 4) {
      local_1f8.x = 0.0;
      local_1f8.y = 0.0;
      local_1f8.z = 0.0;
      local_208.x = 0.0;
      local_208.y = 0.0;
      local_208.z = 0.0;
      *(int *)((long)__x->mIndices + lVar17) =
           (int)(((long)*(pointer *)&(this_02->super_BaseImporter).importerUnits._M_t._M_impl -
                 (long)((_Vector_impl_data *)&(this_02->super_BaseImporter)._vptr_BaseImporter)->
                       _M_start) / 0xc);
      l = *(uint *)((long)m3d->m3d_->face->vertex + lVar17 + lVar13);
      pmVar1 = m3d->m3d_->vertex;
      local_1d0 = (char *)CONCAT44(pmVar1[l].y,pmVar1[l].x);
      local_1c8 = pmVar1[l].z;
      pMVar16 = this_02;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_02,
                 (value_type *)&local_1d0);
      local_1a8[0] = mkColor(pMVar16,m3d->m3d_->vertex[l].color);
      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::emplace_back<aiColor4t<float>>
                (local_238,local_1a8);
      pmVar10 = m3d->m3d_;
      if (((pmVar10->vertex[l].skinid < 0xfffffffe) && (pmVar10->skin != (m3ds_t *)0x0)) &&
         (pmVar10->bone != (m3db_t *)0x0)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230,&l);
        pmVar10 = m3d->m3d_;
      }
      pmVar12 = pmVar10->face;
      l = *(uint *)((long)pmVar12->texcoord + lVar17 + lVar13);
      uVar8 = (ulong)l;
      if (uVar8 != 0xffffffff) {
        local_1f8.y = pmVar10->tmap[uVar8].v;
        local_1f8.x = pmVar10->tmap[uVar8].u;
        local_1f8.z = 0.0;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_228,
                   &local_1f8);
        pmVar10 = m3d->m3d_;
        pmVar12 = pmVar10->face;
      }
      l = *(uint *)((long)pmVar12->normal + lVar17 + lVar13);
      uVar8 = (ulong)l;
      if (uVar8 != 0xffffffff) {
        pmVar1 = pmVar10->vertex;
        local_208.y = pmVar1[uVar8].y;
        local_208.x = pmVar1[uVar8].x;
        local_208.z = pmVar1[uVar8].z;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_220,
                   &local_208);
      }
    }
    std::vector<aiFace,_std::allocator<aiFace>_>::push_back(local_1d8,__x);
    aiFace::~aiFace(__x);
    operator_delete(__x,0x10);
    lVar13 = lVar13 + 0x28;
    uVar8 = local_210;
    uVar14 = local_1b0 + 1;
  }
  if (((pMesh != (aiMesh *)0x0) &&
      (*(pointer *)&(this_02->super_BaseImporter).importerUnits._M_t._M_impl !=
       ((_Vector_impl_data *)&(this_02->super_BaseImporter)._vptr_BaseImporter)->_M_start)) &&
     ((faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.super__Vector_impl_data.
      _M_start)) {
    populateMesh(local_1e8,m3d,pMesh,faces,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_02,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_220,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_228,
                 (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_238,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)p_Var7,&pMesh);
  }
  pMVar16->mScene->mNumMeshes =
       (uint)((ulong)((long)(p_Var7->_M_impl).super__Vector_impl_data._M_finish -
                     (long)(p_Var7->_M_impl).super__Vector_impl_data._M_start) >> 3);
  paVar2 = pMVar16->mScene;
  ppaVar11 = (aiMesh **)operator_new__((ulong)paVar2->mNumMeshes << 3);
  paVar2->mMeshes = ppaVar11;
  __src = (p_Var7->_M_impl).super__Vector_impl_data._M_start;
  __n = (long)(p_Var7->_M_impl).super__Vector_impl_data._M_finish - (long)__src;
  ppaVar15 = __src;
  if (__n != 0) {
    memmove(pMVar16->mScene->mMeshes,__src,__n);
    __src = (p_Var7->_M_impl).super__Vector_impl_data._M_finish;
    ppaVar15 = (p_Var7->_M_impl).super__Vector_impl_data._M_start;
  }
  pMVar16->mScene->mRootNode->mNumMeshes = (uint)((ulong)((long)__src - (long)ppaVar15) >> 3);
  lVar13 = (long)(p_Var7->_M_impl).super__Vector_impl_data._M_finish -
           (long)(p_Var7->_M_impl).super__Vector_impl_data._M_start;
  uVar8 = 0xffffffffffffffff;
  if (-1 < lVar13) {
    uVar8 = lVar13 >> 1;
  }
  puVar9 = (uint *)operator_new__(uVar8);
  pMVar16->mScene->mRootNode->mMeshes = puVar9;
  for (uVar6 = 0;
      (ulong)uVar6 <
      (ulong)((long)(p_Var7->_M_impl).super__Vector_impl_data._M_finish -
              (long)(p_Var7->_M_impl).super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    pMVar16->mScene->mRootNode->mMeshes[uVar6] = uVar6;
  }
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base(p_Var7);
  operator_delete(p_Var7,0x18);
  if (faces != (vector<aiFace,_std::allocator<aiFace>_> *)0x0) {
    std::vector<aiFace,_std::allocator<aiFace>_>::~vector(faces);
    operator_delete(faces,0x18);
  }
  if (this_02 != (M3DImporter *)0x0) {
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              ((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_02);
    operator_delete(this_02,0x18);
  }
  p_Var5 = local_220;
  if (local_220 != (_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              (local_220);
    operator_delete(p_Var5,0x18);
  }
  p_Var5 = local_228;
  p_Var4 = local_230;
  if (local_228 != (_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              (local_228);
    operator_delete(p_Var5,0x18);
  }
  pvVar3 = local_238;
  if (local_238 != (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0) {
    std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
              ((_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_238);
    operator_delete(pvVar3,0x18);
  }
  if (p_Var4 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var4);
    operator_delete(p_Var4,0x18);
  }
  return;
}

Assistant:

void M3DImporter::importMeshes(const M3DWrapper &m3d) {
	unsigned int i, j, k, l, numpoly = 3, lastMat = M3D_INDEXMAX;
	std::vector<aiMesh *> *meshes = new std::vector<aiMesh *>();
	std::vector<aiFace> *faces = nullptr;
	std::vector<aiVector3D> *vertices = nullptr;
	std::vector<aiVector3D> *normals = nullptr;
	std::vector<aiVector3D> *texcoords = nullptr;
	std::vector<aiColor4D> *colors = nullptr;
	std::vector<unsigned int> *vertexids = nullptr;
	aiMesh *pMesh = nullptr;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);
	ai_assert(mScene->mRootNode != nullptr);

	ASSIMP_LOG_DEBUG_F("M3D: importMeshes ", m3d->numface);

	for (i = 0; i < m3d->numface; i++) {
		// we must switch mesh if material changes
		if (lastMat != m3d->face[i].materialid) {
			lastMat = m3d->face[i].materialid;
			if (pMesh && vertices && vertices->size() && faces && faces->size()) {
				populateMesh(m3d, pMesh, faces, vertices, normals, texcoords, colors, vertexids);
				meshes->push_back(pMesh);
				delete faces;
				delete vertices;
				delete normals;
				delete texcoords;
				delete colors;
				delete vertexids; // this is not stored in pMesh, just to collect bone vertices
			}
			pMesh = new aiMesh;
			pMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
			pMesh->mMaterialIndex = lastMat + 1;
			faces = new std::vector<aiFace>();
			vertices = new std::vector<aiVector3D>();
			normals = new std::vector<aiVector3D>();
			texcoords = new std::vector<aiVector3D>();
			colors = new std::vector<aiColor4D>();
			vertexids = new std::vector<unsigned int>();
		}
		// add a face to temporary vector
		aiFace *pFace = new aiFace;
		pFace->mNumIndices = numpoly;
		pFace->mIndices = new unsigned int[numpoly];
		for (j = 0; j < numpoly; j++) {
			aiVector3D pos, uv, norm;
			k = static_cast<unsigned int>(vertices->size());
			pFace->mIndices[j] = k;
			l = m3d->face[i].vertex[j];
			pos.x = m3d->vertex[l].x;
			pos.y = m3d->vertex[l].y;
			pos.z = m3d->vertex[l].z;
			vertices->push_back(pos);
			colors->push_back(mkColor(m3d->vertex[l].color));
			// add a bone to temporary vector
			if (m3d->vertex[l].skinid != M3D_UNDEF && m3d->vertex[l].skinid != M3D_INDEXMAX && m3d->skin && m3d->bone) {
				// this is complicated, because M3D stores a list of bone id / weight pairs per
				// vertex but assimp uses lists of local vertex id/weight pairs per local bone list
				vertexids->push_back(l);
			}
			l = m3d->face[i].texcoord[j];
			if (l != M3D_UNDEF) {
				uv.x = m3d->tmap[l].u;
				uv.y = m3d->tmap[l].v;
				uv.z = 0.0;
				texcoords->push_back(uv);
			}
			l = m3d->face[i].normal[j];
			if (l != M3D_UNDEF) {
				norm.x = m3d->vertex[l].x;
				norm.y = m3d->vertex[l].y;
				norm.z = m3d->vertex[l].z;
				normals->push_back(norm);
			}
		}
		faces->push_back(*pFace);
		delete pFace;
	}
	// if there's data left in the temporary vectors, flush them
	if (pMesh && vertices->size() && faces->size()) {
		populateMesh(m3d, pMesh, faces, vertices, normals, texcoords, colors, vertexids);
		meshes->push_back(pMesh);
	}

	// create global mesh list in scene
	mScene->mNumMeshes = static_cast<unsigned int>(meshes->size());
	mScene->mMeshes = new aiMesh *[mScene->mNumMeshes];
	std::copy(meshes->begin(), meshes->end(), mScene->mMeshes);

	// create mesh indeces in root node
	mScene->mRootNode->mNumMeshes = static_cast<unsigned int>(meshes->size());
	mScene->mRootNode->mMeshes = new unsigned int[meshes->size()];
	for (i = 0; i < meshes->size(); i++) {
		mScene->mRootNode->mMeshes[i] = i;
	}

	delete meshes;
	if (faces) delete faces;
	if (vertices) delete vertices;
	if (normals) delete normals;
	if (texcoords) delete texcoords;
	if (colors) delete colors;
	if (vertexids) delete vertexids;
}